

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_text_to_content_json.cpp
# Opt level: O0

string * sha256(string *__return_storage_ptr__,string *data)

{
  uchar *d;
  size_t n;
  allocator local_39;
  uchar local_38 [8];
  uint8_t digest [32];
  string *data_local;
  
  digest._24_8_ = data;
  d = (uchar *)std::__cxx11::string::data();
  n = std::__cxx11::string::size();
  SHA256(d,n,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)local_38,0x20,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(const std::string &data) {
  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(reinterpret_cast<const uint8_t *>(data.data()), data.size(), digest);
  return std::string{reinterpret_cast<const char *>(digest),
                     SHA256_DIGEST_LENGTH};
}